

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O3

GLuint __thiscall ShaderDb::load_shader_file(ShaderDb *this,string *p_filepath,ShaderType p_type)

{
  GLuint GVar1;
  ShaderType local_34;
  string local_30;
  
  local_34 = (ShaderType)p_filepath;
  read_shader_code_file(&local_30,(string *)this,p_type);
  GVar1 = compile_shader(&local_30,(ShaderType)p_filepath);
  if (GVar1 == 0) {
    GVar1 = 0;
  }
  else {
    GVar1 = add_shader_file(GVar1,(string *)this,&local_30,&local_34);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return GVar1;
}

Assistant:

GLuint ShaderDb::load_shader_file(
    const std::string &p_filepath,
    const ShaderType p_type) noexcept
{
    const auto &shader_data = read_shader_code_file(p_filepath, p_type);
    GLuint shader_id = compile_shader(shader_data, p_type);
    if (shader_id != DEFAULT_SHADER_ID)
    {
        return add_shader_file(
            shader_id,
            p_filepath,
            shader_data,
            p_type);
    }
    return shader_id;
}